

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_message.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::csharp::MessageGenerator::HasNestedGeneratedTypes
          (MessageGenerator *this)

{
  Descriptor *pDVar1;
  long lVar2;
  ulong uVar3;
  bool bVar4;
  ulong uVar5;
  long *plVar6;
  ulong uVar7;
  
  pDVar1 = this->descriptor_;
  bVar4 = true;
  if (*(int *)(pDVar1 + 0x58) < 1) {
    uVar5 = (ulong)*(int *)(pDVar1 + 0x48);
    bVar4 = 0 < (long)uVar5;
    if ((0 < (long)uVar5) &&
       (*(char *)(*(long *)(*(long *)(pDVar1 + 0x50) + 0x20) + 0x6b) == '\x01')) {
      plVar6 = (long *)(*(long *)(pDVar1 + 0x50) + 200);
      uVar3 = 1;
      do {
        uVar7 = uVar3;
        if (uVar5 == uVar7) break;
        lVar2 = *plVar6;
        plVar6 = plVar6 + 0x15;
        uVar3 = uVar7 + 1;
      } while (*(char *)(lVar2 + 0x6b) != '\0');
      return uVar7 < uVar5;
    }
  }
  return bVar4;
}

Assistant:

bool MessageGenerator::HasNestedGeneratedTypes()
{
  if (descriptor_->enum_type_count() > 0) {
    return true;
  }
  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    if (!IsMapEntryMessage(descriptor_->nested_type(i))) {
      return true;
    }
  }
  return false;
}